

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* google::protobuf::compiler::cpp::anon_unknown_2::Keywords(void)

{
  int iVar1;
  anon_class_1_0_00000001 *this;
  
  if (cpp::(anonymous_namespace)::Keywords()::keywords == '\0') {
    this = (anon_class_1_0_00000001 *)&cpp::(anonymous_namespace)::Keywords()::keywords;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      Keywords::keywords = Keywords::anon_class_1_0_00000001::operator()(this);
      __cxa_guard_release(&cpp::(anonymous_namespace)::Keywords()::keywords);
    }
  }
  return Keywords::keywords;
}

Assistant:

const absl::flat_hash_set<absl::string_view>& Keywords() {
  static const auto* keywords = [] {
    auto* keywords = new absl::flat_hash_set<absl::string_view>();

    for (const auto keyword : kKeywordList) {
      keywords->emplace(keyword);
    }
    return keywords;
  }();
  return *keywords;
}